

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

bool image_match::has_supported_extension(path *ext)

{
  source_loc loc;
  logger *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined4 uStack_54;
  string local_48;
  basic_string_view<char> local_28;
  
  this = spdlog::default_logger_raw();
  CLI::std::filesystem::__cxx11::path::string(&local_48,(path *)ext);
  local_28.data_ = "Checking extension {}";
  local_28.size_ = 0x15;
  loc._12_4_ = uStack_54;
  loc.line = 0x6c;
  loc.filename = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
  ;
  loc.funcname = "has_supported_extension";
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
            (this,loc,debug,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  CLI::std::filesystem::__cxx11::path::string(&local_48,(path *)ext);
  pbVar1 = std::
           __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_,SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_,
                      &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   SUPPORTED_IMAGE_EXTENSIONS_abi_cxx11_;
}

Assistant:

bool
has_supported_extension(const std::filesystem::path& ext)
{
    SPDLOG_DEBUG("Checking extension {}", ext.string());

    return std::find(SUPPORTED_IMAGE_EXTENSIONS.begin(),
                     SUPPORTED_IMAGE_EXTENSIONS.end(),
                     ext.string()) != SUPPORTED_IMAGE_EXTENSIONS.end();
}